

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeChangeP4Full(Vdbe *p,Op *pOp,char *zP4,int n)

{
  size_t sVar1;
  void *__dest;
  ulong __n;
  
  if (pOp->p4type != '\0') {
    freeP4(p->db,(int)pOp->p4type,(pOp->p4).p);
    pOp->p4type = '\0';
    (pOp->p4).p = (void *)0x0;
  }
  if (-1 < n) {
    if (n == 0) {
      if (zP4 == (char *)0x0) {
        n = 0;
      }
      else {
        sVar1 = strlen(zP4);
        n = (uint)sVar1 & 0x3fffffff;
      }
    }
    if (zP4 == (char *)0x0) {
      __dest = (void *)0x0;
    }
    else {
      __n = (ulong)(uint)n;
      __dest = sqlite3DbMallocRawNN(p->db,__n + 1);
      if (__dest != (void *)0x0) {
        memcpy(__dest,zP4,__n);
        *(undefined1 *)((long)__dest + __n) = 0;
      }
    }
    (pOp->p4).p = __dest;
    pOp->p4type = -7;
    return;
  }
  sqlite3VdbeChangeP4(p,(int)((ulong)((long)pOp - (long)p->aOp) >> 3) * -0x55555555,zP4,n);
  return;
}

Assistant:

static void SQLITE_NOINLINE vdbeChangeP4Full(
  Vdbe *p,
  Op *pOp,
  const char *zP4,
  int n
){
  if( pOp->p4type ){
    freeP4(p->db, pOp->p4type, pOp->p4.p);
    pOp->p4type = 0;
    pOp->p4.p = 0;
  }
  if( n<0 ){
    sqlite3VdbeChangeP4(p, (int)(pOp - p->aOp), zP4, n);
  }else{
    if( n==0 ) n = sqlite3Strlen30(zP4);
    pOp->p4.z = sqlite3DbStrNDup(p->db, zP4, n);
    pOp->p4type = P4_DYNAMIC;
  }
}